

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperCut.c
# Opt level: O0

void Map_CutTableRestart(Map_CutTable_t *p)

{
  int local_14;
  int i;
  Map_CutTable_t *p_local;
  
  local_14 = 0;
  while( true ) {
    if (p->nCuts <= local_14) {
      p->nCuts = 0;
      return;
    }
    if (p->pBins[p->pCuts[local_14]] == (Map_Cut_t *)0x0) break;
    p->pBins[p->pCuts[local_14]] = (Map_Cut_t *)0x0;
    local_14 = local_14 + 1;
  }
  __assert_fail("p->pBins[ p->pCuts[i] ]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/mapper/mapperCut.c"
                ,0x3c1,"void Map_CutTableRestart(Map_CutTable_t *)");
}

Assistant:

void Map_CutTableRestart( Map_CutTable_t * p )
{
    int i;
    for ( i = 0; i < p->nCuts; i++ )
    {
        assert( p->pBins[ p->pCuts[i] ] );
        p->pBins[ p->pCuts[i] ] = NULL;
    }
    p->nCuts = 0;
}